

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O2

void png_do_swap(png_row_infop row_info,png_bytep row)

{
  ushort *puVar1;
  byte bVar2;
  png_uint_32 pVar3;
  long lVar4;
  
  if (row_info->bit_depth == '\x10') {
    bVar2 = row_info->channels;
    pVar3 = row_info->width;
    for (lVar4 = 0; bVar2 * pVar3 != (int)lVar4; lVar4 = lVar4 + 1) {
      puVar1 = (ushort *)(row + lVar4 * 2);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_swap(png_row_infop row_info, png_bytep row)
{
   png_debug(1, "in png_do_swap");

   if (row_info->bit_depth == 16)
   {
      png_bytep rp = row;
      png_uint_32 i;
      png_uint_32 istop= row_info->width * row_info->channels;

      for (i = 0; i < istop; i++, rp += 2)
      {
#ifdef PNG_BUILTIN_BSWAP16_SUPPORTED
         /* Feature added to libpng-1.6.11 for testing purposes, not
          * enabled by default.
          */
         *(png_uint_16*)rp = __builtin_bswap16(*(png_uint_16*)rp);
#else
         png_byte t = *rp;
         *rp = *(rp + 1);
         *(rp + 1) = t;
#endif
      }
   }
}